

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void stbtt_GetScaledFontVMetrics
               (uchar *fontdata,int index,float size,float *ascent,float *descent,float *lineGap)

{
  float *in_RCX;
  float *in_RDX;
  stbtt_fontinfo *in_RDI;
  float *in_R8;
  float in_XMM0_Da;
  float fVar1;
  stbtt_fontinfo info;
  float scale;
  int i_lineGap;
  int i_descent;
  int i_ascent;
  undefined4 in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  int *in_stack_ffffffffffffff28;
  stbtt_fontinfo *in_stack_ffffffffffffff30;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  stbtt_GetFontOffsetForIndex((uchar *)in_RDI,(int)in_stack_ffffffffffffff1c);
  stbtt_InitFont(in_RDI,(uchar *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
  if (in_XMM0_Da <= 0.0) {
    fVar1 = stbtt_ScaleForMappingEmToPixels(in_RDI,in_stack_ffffffffffffff1c);
  }
  else {
    fVar1 = stbtt_ScaleForPixelHeight(in_RDI,in_stack_ffffffffffffff1c);
  }
  stbtt_GetFontVMetrics
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(int *)in_RDI,
             (int *)CONCAT44(fVar1,in_stack_ffffffffffffff18));
  *in_RDX = (float)local_2c * fVar1;
  *in_RCX = (float)local_30 * fVar1;
  *in_R8 = (float)local_34 * fVar1;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetScaledFontVMetrics(const unsigned char *fontdata, int index, float size, float *ascent, float *descent, float *lineGap)
{
int i_ascent, i_descent, i_lineGap;
float scale;
stbtt_fontinfo info;
stbtt_InitFont(&info, fontdata, stbtt_GetFontOffsetForIndex(fontdata, index));
scale = size > 0 ? stbtt_ScaleForPixelHeight(&info, size) : stbtt_ScaleForMappingEmToPixels(&info, -size);
stbtt_GetFontVMetrics(&info, &i_ascent, &i_descent, &i_lineGap);
*ascent  = (float) i_ascent  * scale;
*descent = (float) i_descent * scale;
*lineGap = (float) i_lineGap * scale;
}